

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int lookup_path_in_array(char *path_elem,MMDB_s *mmdb,MMDB_entry_data_s *entry_data)

{
  int iVar1;
  int *piVar2;
  undefined1 local_88 [4];
  int status_2;
  MMDB_entry_data_s value;
  int status;
  int status_1;
  long i;
  long array_index;
  char *pcStack_38;
  int saved_errno;
  char *first_invalid;
  MMDB_entry_data_s *pMStack_28;
  uint32_t size;
  MMDB_entry_data_s *entry_data_local;
  MMDB_s *mmdb_local;
  char *path_elem_local;
  
  first_invalid._4_4_ = entry_data->data_size;
  pMStack_28 = entry_data;
  entry_data_local = (MMDB_entry_data_s *)mmdb;
  mmdb_local = (MMDB_s *)path_elem;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  piVar2 = __errno_location();
  *piVar2 = 0;
  i = strtol((char *)mmdb_local,&stack0xffffffffffffffc8,10);
  piVar2 = __errno_location();
  if (*piVar2 == 0x22) {
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    path_elem_local._4_4_ = 8;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    if ((i < 0) && (i = (ulong)first_invalid._4_4_ + i, i < 0)) {
      path_elem_local._4_4_ = 9;
    }
    else if ((*pcStack_38 == '\0') && ((ulong)i < (ulong)first_invalid._4_4_)) {
      for (_status = 0; _status < i; _status = _status + 1) {
        value.type = decode_one((MMDB_s *)entry_data_local,pMStack_28->offset_to_next,pMStack_28);
        if (value.type != 0) {
          return value.type;
        }
        iVar1 = skip_map_or_array((MMDB_s *)entry_data_local,pMStack_28);
        if (iVar1 != 0) {
          return iVar1;
        }
        value.data_size = 0;
      }
      path_elem_local._4_4_ =
           decode_one_follow((MMDB_s *)entry_data_local,pMStack_28->offset_to_next,
                             (MMDB_entry_data_s *)local_88);
      if (path_elem_local._4_4_ == 0) {
        memcpy(pMStack_28,local_88,0x30);
        path_elem_local._4_4_ = 0;
      }
    }
    else {
      path_elem_local._4_4_ = 9;
    }
  }
  return path_elem_local._4_4_;
}

Assistant:

static int lookup_path_in_array(const char *path_elem,
                                const MMDB_s *const mmdb,
                                MMDB_entry_data_s *entry_data) {
    uint32_t size = entry_data->data_size;
    char *first_invalid;

    int saved_errno = errno;
    errno = 0;
    long array_index = strtol(path_elem, &first_invalid, 10);
    if (ERANGE == errno) {
        errno = saved_errno;
        return MMDB_INVALID_LOOKUP_PATH_ERROR;
    }
    errno = saved_errno;

    if (array_index < 0) {
        array_index += size;

        if (array_index < 0) {
            return MMDB_LOOKUP_PATH_DOES_NOT_MATCH_DATA_ERROR;
        }
    }

    if (*first_invalid || (unsigned long)array_index >= size) {
        return MMDB_LOOKUP_PATH_DOES_NOT_MATCH_DATA_ERROR;
    }

    for (long i = 0; i < array_index; i++) {
        /* We don't want to follow a pointer here. If the next element is a
         * pointer we simply skip it and keep going */
        CHECKED_DECODE_ONE(mmdb, entry_data->offset_to_next, entry_data);
        int status = skip_map_or_array(mmdb, entry_data);
        if (MMDB_SUCCESS != status) {
            return status;
        }
    }

    MMDB_entry_data_s value;
    CHECKED_DECODE_ONE_FOLLOW(mmdb, entry_data->offset_to_next, &value);
    memcpy(entry_data, &value, sizeof(MMDB_entry_data_s));

    return MMDB_SUCCESS;
}